

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O1

void Fxch_DivPrint(Fxch_Man_t *pFxchMan,int iDiv)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  Hsh_VecMan_t *pHVar4;
  ulong uVar5;
  long lVar6;
  
  if (-1 < iDiv) {
    uVar5 = (ulong)(uint)iDiv;
    pHVar4 = pFxchMan->pDivHash;
    if (iDiv < pHVar4->vMap->nSize) {
      iVar2 = pHVar4->vMap->pArray[uVar5];
      if (((long)iVar2 < 0) || (pHVar4->vData->nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar1 = pHVar4->vData->pArray + iVar2;
      iVar2 = *piVar1;
      (pHVar4->vTemp).nCap = iVar2;
      (pHVar4->vTemp).nSize = iVar2;
      (pHVar4->vTemp).pArray = piVar1 + 2;
      printf("Div %7d : ",uVar5);
      if (pFxchMan->vDivWeights->nSize <= iDiv) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecFlt.h"
                      ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
      }
      printf("Weight %12.5f  ",(double)pFxchMan->vDivWeights->pArray[uVar5]);
      if (0 < (pHVar4->vTemp).nSize) {
        lVar6 = 0;
        do {
          uVar3 = (pHVar4->vTemp).pArray[lVar6];
          if ((int)uVar3 < 0) goto LAB_004bf315;
          if ((uVar3 & 1) == 0) {
            printf("%d(1)",(ulong)(uVar3 >> 1));
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pHVar4->vTemp).nSize);
      }
      printf(" + ");
      if (0 < (pHVar4->vTemp).nSize) {
        lVar6 = 0;
        do {
          uVar3 = (pHVar4->vTemp).pArray[lVar6];
          if ((int)uVar3 < 0) {
LAB_004bf315:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if ((uVar3 & 1) != 0) {
            printf("%d(2)",(ulong)(uVar3 >> 1));
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < (pHVar4->vTemp).nSize);
      }
      printf(" Lits =%7d  ",(ulong)(uint)pFxchMan->nLits);
      printf("Divs =%8d  \n",(ulong)(uint)pFxchMan->pDivHash->vMap->nSize);
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Fxch_DivPrint( Fxch_Man_t* pFxchMan,
                    int iDiv )
{
    Vec_Int_t* vDiv = Hsh_VecReadEntry( pFxchMan->pDivHash, iDiv );
    int i,
        Lit;

    printf( "Div %7d : ", iDiv );
    printf( "Weight %12.5f  ", Vec_FltEntry( pFxchMan->vDivWeights, iDiv ) );

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( !Abc_LitIsCompl( Lit ) )
            printf( "%d(1)", Abc_Lit2Var( Lit ) );

    printf( " + " );

    Vec_IntForEachEntry( vDiv, Lit, i )
        if ( Abc_LitIsCompl( Lit ) )
            printf( "%d(2)", Abc_Lit2Var( Lit ) );

    printf( " Lits =%7d  ", pFxchMan->nLits );
    printf( "Divs =%8d  \n", Hsh_VecSize( pFxchMan->pDivHash ) );
}